

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_paged_audio_buffer_data_allocate_and_append_page
                    (ma_paged_audio_buffer_data *pData,ma_uint32 pageSizeInFrames,void *pInitialData
                    ,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  ma_paged_audio_buffer_page *pPage;
  ma_paged_audio_buffer_page *local_10;
  
  mVar1 = ma_paged_audio_buffer_data_allocate_page
                    (pData,(ulong)pageSizeInFrames,pInitialData,pAllocationCallbacks,&local_10);
  if (mVar1 == MA_SUCCESS) {
    mVar1 = ma_paged_audio_buffer_data_append_page(pData,local_10);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_allocate_and_append_page(ma_paged_audio_buffer_data* pData, ma_uint32 pageSizeInFrames, const void* pInitialData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_result result;
    ma_paged_audio_buffer_page* pPage;

    result = ma_paged_audio_buffer_data_allocate_page(pData, pageSizeInFrames, pInitialData, pAllocationCallbacks, &pPage);
    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_paged_audio_buffer_data_append_page(pData, pPage);    /* <-- Should never fail. */
}